

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O3

QList<int> * __thiscall
QAccessibleTable::selectedRows(QList<int> *__return_storage_ptr__,QAccessibleTable *this)

{
  long lVar1;
  int *piVar2;
  long lVar3;
  QAbstractItemView *pQVar4;
  QItemSelectionModel *pQVar5;
  QModelIndexList *__range1;
  long lVar6;
  QAccessibleObject *pQVar7;
  long in_FS_OFFSET;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = &this->super_QAccessibleObject;
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar7);
  pQVar4 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  pQVar5 = QAbstractItemView::selectionModel(pQVar4);
  if (pQVar5 == (QItemSelectionModel *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (int *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (int *)0x0;
    (__return_storage_ptr__->d).size = 0;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = 0xaaaaaaaa;
    uStack_54 = 0xaaaaaaaa;
    uStack_50 = 0xaaaaaaaa;
    uStack_4c = 0xaaaaaaaa;
    (**(code **)(*(long *)pQVar7 + 0x18))(pQVar7);
    pQVar4 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject)
    ;
    QAbstractItemView::selectionModel(pQVar4);
    QItemSelectionModel::selectedRows((int)&local_58);
    QList<int>::reserve(__return_storage_ptr__,(qsizetype)local_48);
    if (local_48 != (undefined1 *)0x0) {
      lVar3 = CONCAT44(uStack_4c,uStack_50);
      lVar1 = (long)local_48 * 0x18;
      lVar6 = 0;
      do {
        local_34 = *(int *)(lVar3 + lVar6);
        QtPrivate::QPodArrayOps<int>::emplace<int&>
                  ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                   &local_34);
        QList<int>::end(__return_storage_ptr__);
        lVar6 = lVar6 + 0x18;
      } while (lVar1 != lVar6);
    }
    piVar2 = (int *)CONCAT44(uStack_54,local_58);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),0x18,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QList<int> QAccessibleTable::selectedRows() const
{
    if (!view()->selectionModel())
        return QList<int>();
    QList<int> rows;
    const QModelIndexList selectedRows = view()->selectionModel()->selectedRows();
    rows.reserve(selectedRows.size());
    for (const QModelIndex &index : selectedRows)
        rows.append(index.row());

    return rows;
}